

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O3

Bdc_Man_t * Bdc_ManAlloc(Bdc_Par_t *pPars)

{
  undefined4 uVar1;
  void *pvVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  Bdc_Man_t *pBVar5;
  Bdc_Fun_t *pBVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Bdc_Fun_t **ppBVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  void **ppvVar12;
  Vec_Ptr_t *pVVar13;
  uint *puVar14;
  uint uVar15;
  int iVar16;
  int nWords;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  undefined1 auVar24 [16];
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  
  pBVar5 = (Bdc_Man_t *)calloc(1,0x148);
  uVar20 = pPars->nVarsMax;
  uVar22 = (ulong)uVar20;
  if (0xd < uVar20 - 2) {
    __assert_fail("pPars->nVarsMax > 1 && pPars->nVarsMax < 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcCore.c"
                  ,0x49,"Bdc_Man_t *Bdc_ManAlloc(Bdc_Par_t *)");
  }
  pBVar5->pPars = pPars;
  uVar15 = uVar20 - 5;
  uVar18 = 0;
  uVar3 = 1 << ((byte)uVar15 & 0x1f);
  if (uVar20 < 6) {
    uVar3 = 1;
  }
  uVar17 = (ulong)uVar3;
  pBVar5->nWords = uVar3;
  pBVar5->nDivsLimit = 200;
  pBVar5->nNodesAlloc = 0x200;
  if (uVar20 < 6) {
    uVar15 = 0;
  }
  pBVar6 = (Bdc_Fun_t *)malloc(0x7000);
  pBVar5->pNodes = pBVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = uVar3 << 0xc;
  piVar8 = (int *)calloc(1,(ulong)(uVar3 << 0xc) << 2);
  pVVar7->pArray = piVar8;
  pBVar5->vMemory = pVVar7;
  pVVar7->nSize = 0;
  pBVar5->nTableSize = 1 << ((byte)uVar20 & 0x1f);
  ppBVar9 = (Bdc_Fun_t **)calloc(1,8L << ((byte)uVar20 & 0x3f));
  pBVar5->pTable = ppBVar9;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 0x100;
  pVVar10->nSize = 0;
  piVar11 = (int *)malloc(0x400);
  pVVar10->pArray = piVar11;
  pBVar5->vSpots = pVVar10;
  ppvVar12 = (void **)malloc((uVar17 * 4 + 8) * uVar22);
  auVar4 = _DAT_008403e0;
  lVar19 = uVar22 - 1;
  auVar24._8_4_ = (int)lVar19;
  auVar24._0_8_ = lVar19;
  auVar24._12_4_ = (int)((ulong)lVar19 >> 0x20);
  auVar24 = auVar24 ^ _DAT_008403e0;
  auVar26 = _DAT_008403d0;
  do {
    auVar27 = auVar26 ^ auVar4;
    lVar19 = auVar26._8_8_;
    if ((bool)(~(auVar27._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar27._0_4_ ||
                auVar24._4_4_ < auVar27._4_4_) & 1)) {
      *(ulong *)((long)ppvVar12 + uVar18) =
           (long)ppvVar12 + (auVar26._0_8_ << (ulong)uVar15) * 4 + uVar22 * 8;
    }
    if ((auVar27._12_4_ != auVar24._12_4_ || auVar27._8_4_ <= auVar24._8_4_) &&
        auVar27._12_4_ <= auVar24._12_4_) {
      *(ulong *)((long)ppvVar12 + uVar18 + 8) = (long)ppvVar12 + lVar19 * 4 + uVar22 * 8;
    }
    auVar26._0_8_ = auVar26._0_8_ + 2;
    auVar26._8_8_ = lVar19 + 2;
    uVar18 = uVar18 + 0x10;
  } while ((uVar20 * 8 + 8 & 0xf0) != uVar18);
  pVVar13 = (Vec_Ptr_t *)malloc(0x10);
  auVar24 = _DAT_008403e0;
  pVVar13->nSize = uVar20;
  pVVar13->nCap = uVar20;
  pVVar13->pArray = ppvVar12;
  auVar26 = _DAT_008403d0;
  auVar4 = _DAT_008403c0;
  lVar19 = uVar17 - 1;
  auVar27._8_4_ = (int)lVar19;
  auVar27._0_8_ = lVar19;
  auVar27._12_4_ = (int)((ulong)lVar19 >> 0x20);
  uVar18 = 0;
  auVar27 = auVar27 ^ auVar24;
  do {
    pvVar2 = ppvVar12[uVar18];
    iVar23 = auVar27._0_4_;
    iVar16 = auVar27._4_4_;
    iVar25 = auVar27._12_4_;
    if (uVar18 < 5) {
      uVar1 = (&DAT_0094c370)[uVar18];
      uVar21 = 0;
      auVar29 = auVar26;
      auVar28 = auVar4;
      do {
        auVar30 = auVar29 ^ auVar24;
        if ((bool)(~(auVar30._4_4_ == iVar16 && iVar23 < auVar30._0_4_ || iVar16 < auVar30._4_4_) &
                  1)) {
          *(undefined4 *)((long)pvVar2 + uVar21 * 4) = uVar1;
        }
        if ((auVar30._12_4_ != iVar25 || auVar30._8_4_ <= auVar27._8_4_) && auVar30._12_4_ <= iVar25
           ) {
          *(undefined4 *)((long)pvVar2 + uVar21 * 4 + 4) = uVar1;
        }
        iVar31 = SUB164(auVar28 ^ auVar24,4);
        if (iVar31 <= iVar16 && (iVar31 != iVar16 || SUB164(auVar28 ^ auVar24,0) <= iVar23)) {
          *(undefined4 *)((long)pvVar2 + uVar21 * 4 + 8) = uVar1;
          *(undefined4 *)((long)pvVar2 + uVar21 * 4 + 0xc) = uVar1;
        }
        uVar21 = uVar21 + 4;
        lVar19 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + 4;
        auVar29._8_8_ = lVar19 + 4;
        lVar19 = auVar28._8_8_;
        auVar28._0_8_ = auVar28._0_8_ + 4;
        auVar28._8_8_ = lVar19 + 4;
      } while ((uVar3 + 3 & 0xfffffffc) != uVar21);
    }
    else {
      uVar20 = 1 << ((char)uVar18 - 5U & 0x1f);
      uVar21 = 0;
      auVar30 = auVar26;
      do {
        auVar29 = auVar30 ^ auVar24;
        if ((bool)(~(auVar29._4_4_ == iVar16 && iVar23 < auVar29._0_4_ || iVar16 < auVar29._4_4_) &
                  1)) {
          *(uint *)((long)pvVar2 + uVar21 * 4) = -(uint)((uVar20 & (uint)uVar21) != 0);
        }
        if ((auVar29._12_4_ != iVar25 || auVar29._8_4_ <= auVar27._8_4_) && auVar29._12_4_ <= iVar25
           ) {
          *(uint *)((long)pvVar2 + uVar21 * 4 + 4) = -(uint)(((uint)uVar21 + 1 & uVar20) != 0);
        }
        uVar21 = uVar21 + 2;
        lVar19 = auVar30._8_8_;
        auVar30._0_8_ = auVar30._0_8_ + 2;
        auVar30._8_8_ = lVar19 + 2;
      } while ((uVar3 + 1 & 0xfffffffe) != uVar21);
    }
    uVar18 = uVar18 + 1;
  } while (uVar18 != uVar22);
  pBVar5->vTruths = pVVar13;
  puVar14 = (uint *)malloc((ulong)(uVar3 * 4) << 2);
  pBVar5->puTemp1 = puVar14;
  puVar14 = puVar14 + uVar17;
  pBVar5->puTemp2 = puVar14;
  pBVar5->puTemp3 = puVar14 + uVar17;
  pBVar5->puTemp4 = puVar14 + uVar17 + uVar17;
  pBVar5->pIsfOL = &pBVar5->IsfOL;
  (pBVar5->IsfOL).uSupp = 0;
  (pBVar5->IsfOL).uUniq = 0;
  lVar19 = (long)pVVar7->nSize + uVar17;
  iVar23 = pVVar7->nCap;
  iVar16 = (int)lVar19;
  puVar14 = (uint *)(piVar8 + (lVar19 - uVar17));
  if (iVar23 < iVar16) {
    puVar14 = (uint *)0x0;
  }
  (pBVar5->IsfOL).puOn = puVar14;
  iVar16 = iVar16 + uVar3;
  pVVar7->nSize = iVar16;
  if (iVar23 < iVar16) {
    (pBVar5->IsfOL).puOff = (uint *)0x0;
  }
  else {
    (pBVar5->IsfOL).puOff = (uint *)(piVar8 + ((long)iVar16 - uVar17));
    pBVar5->pIsfOR = &pBVar5->IsfOR;
    (pBVar5->IsfOR).uSupp = 0;
    (pBVar5->IsfOR).uUniq = 0;
    iVar16 = iVar16 + uVar3;
    puVar14 = (uint *)(piVar8 + ((long)iVar16 - uVar17));
    if (iVar23 < iVar16) {
      puVar14 = (uint *)0x0;
    }
    (pBVar5->IsfOR).puOn = puVar14;
    iVar16 = iVar16 + uVar3;
    pVVar7->nSize = iVar16;
    if (iVar23 < iVar16) {
      (pBVar5->IsfOR).puOff = (uint *)0x0;
    }
    else {
      (pBVar5->IsfOR).puOff = (uint *)(piVar8 + ((long)iVar16 - uVar17));
      pBVar5->pIsfAL = &pBVar5->IsfAL;
      (pBVar5->IsfAL).uSupp = 0;
      (pBVar5->IsfAL).uUniq = 0;
      iVar16 = iVar16 + uVar3;
      puVar14 = (uint *)(piVar8 + ((long)iVar16 - uVar17));
      if (iVar23 < iVar16) {
        puVar14 = (uint *)0x0;
      }
      (pBVar5->IsfAL).puOn = puVar14;
      iVar16 = iVar16 + uVar3;
      pVVar7->nSize = iVar16;
      if (iVar23 < iVar16) {
        (pBVar5->IsfAL).puOff = (uint *)0x0;
      }
      else {
        (pBVar5->IsfAL).puOff = (uint *)(piVar8 + ((long)iVar16 - uVar17));
        pBVar5->pIsfAR = &pBVar5->IsfAR;
        (pBVar5->IsfAR).uSupp = 0;
        (pBVar5->IsfAR).uUniq = 0;
        iVar16 = iVar16 + uVar3;
        puVar14 = (uint *)(piVar8 + ((long)iVar16 - uVar17));
        if (iVar23 < iVar16) {
          puVar14 = (uint *)0x0;
        }
        (pBVar5->IsfAR).puOn = puVar14;
        iVar16 = iVar16 + uVar3;
        pVVar7->nSize = iVar16;
        if (iVar16 <= iVar23) {
          (pBVar5->IsfAR).puOff = (uint *)(piVar8 + ((long)iVar16 - uVar17));
          return pBVar5;
        }
        (pBVar5->IsfAR).puOff = (uint *)0x0;
      }
    }
  }
  __assert_fail("pF->puOff && pF->puOn",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/bdc/bdcInt.h"
                ,0x83,"void Bdc_IsfStart(Bdc_Man_t *, Bdc_Isf_t *)");
}

Assistant:

Bdc_Man_t * Bdc_ManAlloc( Bdc_Par_t * pPars )
{
    Bdc_Man_t * p;
    p = ABC_ALLOC( Bdc_Man_t, 1 );
    memset( p, 0, sizeof(Bdc_Man_t) );
    assert( pPars->nVarsMax > 1 && pPars->nVarsMax < 16 );
    p->pPars = pPars;
    p->nWords = Kit_TruthWordNum( pPars->nVarsMax );
    p->nDivsLimit = 200;
    // internal nodes
    p->nNodesAlloc = 512;
    p->pNodes = ABC_ALLOC( Bdc_Fun_t, p->nNodesAlloc );
    // memory
    p->vMemory = Vec_IntStart( 8 * p->nWords * p->nNodesAlloc );
    Vec_IntClear(p->vMemory);
    // set up hash table
    p->nTableSize = (1 << p->pPars->nVarsMax);
    p->pTable = ABC_ALLOC( Bdc_Fun_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Bdc_Fun_t *) * p->nTableSize );
    p->vSpots = Vec_IntAlloc( 256 );
    // truth tables
    p->vTruths = Vec_PtrAllocTruthTables( p->pPars->nVarsMax );
    p->puTemp1 = ABC_ALLOC( unsigned, 4 * p->nWords );
    p->puTemp2 = p->puTemp1 + p->nWords;
    p->puTemp3 = p->puTemp2 + p->nWords;
    p->puTemp4 = p->puTemp3 + p->nWords;
    // start the internal ISFs
    p->pIsfOL = &p->IsfOL;  Bdc_IsfStart( p, p->pIsfOL );
    p->pIsfOR = &p->IsfOR;  Bdc_IsfStart( p, p->pIsfOR );
    p->pIsfAL = &p->IsfAL;  Bdc_IsfStart( p, p->pIsfAL );
    p->pIsfAR = &p->IsfAR;  Bdc_IsfStart( p, p->pIsfAR );   
    return p; 
}